

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O3

gc_heap_ptr<mjs::array_object> __thiscall
mjs::gc_heap::
allocate_and_construct<mjs::array_object,mjs::gc_heap_ptr<mjs::global_object>const&,mjs::string,mjs::gc_heap_ptr<mjs::object>&,unsigned_int&>
          (gc_heap *this,size_t num_bytes,gc_heap_ptr<mjs::global_object> *args,string *args_1,
          gc_heap_ptr<mjs::object> *args_2,uint *args_3)

{
  uint32_t uVar1;
  slot *this_00;
  undefined8 extraout_RDX;
  allocation_result aVar2;
  gc_heap_ptr<mjs::array_object> gVar3;
  uint32_t *in_stack_00000008;
  
  aVar2 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  this_00 = aVar2.obj;
  if (*(int *)((long)this_00 + -4) == -1) {
    uVar1 = *in_stack_00000008;
    native_object::native_object
              ((native_object *)&this_00->allocation,(string *)args_2,(object_ptr *)args_3);
    this_00->representation = (uint64_t)&PTR_get_002502b0;
    *(uint32_t *)((long)this_00 + 0x24) =
         (args_1->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
    this_00[5].new_position = uVar1;
    native_object::do_add_native_property
              ((native_object *)&this_00->allocation,"length",dont_delete|dont_enum,
               native_object::
               add_native_property<mjs::array_object,_&mjs::array_object::get_length,_&mjs::array_object::put_length>
               ::anon_class_1_0_00000001::__invoke,
               native_object::
               add_native_property<mjs::array_object,_&mjs::array_object::get_length,_&mjs::array_object::put_length>
               ::anon_class_1_0_00000001::__invoke);
    *(undefined4 *)((long)this_00 + -4) = gc_type_info_registration<mjs::array_object>::reg._40_4_;
    (this->pointers_).set_ = (gc_heap_ptr_untyped **)num_bytes;
    (this->pointers_).capacity_ = aVar2.pos;
    attach((gc_heap *)num_bytes,(gc_heap_ptr_untyped *)this);
    gVar3.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar3.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::array_object>)gVar3.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::array_object, Args = <const mjs::gc_heap_ptr<mjs::global_object> &, mjs::string, mjs::gc_heap_ptr<mjs::object> &, unsigned int &>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}